

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# change-base.c
# Opt level: O1

size_t change_base(uint8_t *num,uint8_t from,uint8_t to,uint8_t *target)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  size_t n;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  sVar5 = 0xffffffffffffffff;
  if (0xf6 < (byte)(to - 0xb) && 0xf6 < (byte)(from - 0xb)) {
    uVar7 = 1;
    lVar8 = 0;
    uVar6 = 0;
    do {
      uVar9 = CONCAT71(0,num[lVar8]);
      if (from <= num[lVar8]) {
        return 0xffffffffffffffff;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar7;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar9;
      if (SUB168(auVar1 * auVar2,8) != 0) {
        return 0xffffffffffffffff;
      }
      uVar9 = uVar9 * uVar7;
      bVar10 = CARRY8(uVar6,uVar9);
      uVar6 = uVar6 + uVar9;
      if (bVar10) {
        return 0xffffffffffffffff;
      }
      lVar8 = lVar8 + 1;
      uVar7 = uVar7 * from;
    } while (lVar8 != 0x40);
    uVar7 = (ulong)to;
    sVar5 = 0xffffffffffffffff;
    sVar3 = 0;
    do {
      sVar4 = sVar5;
      if (sVar5 == 0xffffffffffffffff) {
        sVar4 = sVar3;
      }
      target[sVar3] = (uint8_t)(uVar6 % uVar7);
      if (uVar6 < uVar7) {
        sVar5 = sVar4;
      }
      sVar3 = sVar3 + 1;
      uVar6 = uVar6 / uVar7;
    } while (sVar3 != 0x40);
  }
  return sVar5;
}

Assistant:

size_t change_base(const uint8_t num[WIDTH], const uint8_t from, const uint8_t to, uint8_t* target) {
  if (from <= 1 || from > 10 || to <= 1 || to > 10) return (size_t)(-1);

  uint64_t sum = 0;
  uint64_t mul = 1;
  size_t res = (size_t)(-1);

  for (size_t n = 0; n < WIDTH; n++, mul *= from) {
    if (num[n] >= from) return (size_t)(-1);
    // overflow protection
    if (num[n] > UINT64_MAX / mul) return (size_t)(-1);
    if (num[n] * mul > UINT64_MAX - sum) return (size_t)(-1);
    sum += num[n] * mul;
  }

  for (size_t n = 0; n < WIDTH; n++) {
    target[n] = sum % to;
    sum /= to;
    if (sum == 0 && res == (size_t)(-1)) res = n;
  }

  return res;
}